

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeLanguageCommand.cxx
# Opt level: O3

bool cmCMakeLanguageCommand
               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
               cmExecutionStatus *status)

{
  pointer pcVar1;
  char *pcVar2;
  int *piVar3;
  cmMakefile *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ActionMap *pAVar5;
  pointer pcVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  size_t *psVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outArgs;
  size_t *psVar13;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *pvVar14;
  bool bVar15;
  int iVar16;
  cmState *this_00;
  cmListFileContext *pcVar17;
  string *psVar18;
  cmGlobalGenerator *this_01;
  void *__dest;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var19;
  pointer pbVar20;
  ulong uVar21;
  pointer pbVar22;
  undefined1 value [8];
  cmListFileArgument *pcVar23;
  ulong uVar24;
  pointer ppVar25;
  undefined8 uVar26;
  _Alloc_hider _Var27;
  size_type __rlen;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  string_view name;
  string_view name_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  string_view separator;
  size_t expArg;
  SetProviderArgs parsedArgs;
  size_t rawArg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expArgs;
  string fcmasProperty;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> tmpArgs;
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_> methods;
  size_type __dnew;
  Command command;
  anon_class_40_5_733c87e0 moreArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsed;
  anon_class_32_4_cfdc72da finishArgs;
  ulong local_350;
  undefined1 local_348 [8];
  undefined1 auStack_340 [8];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  pointer local_318;
  char *local_310;
  ulong local_300;
  undefined1 local_2f8 [16];
  pointer local_2e8;
  string local_2d8;
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  undefined8 local_278;
  undefined1 local_270 [32];
  bool local_250;
  cmDependencyProvider local_240;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_> local_1e8;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  _Any_data _Stack_1b0;
  char *pcStack_1a0;
  undefined8 local_198;
  undefined1 auStack_190 [8];
  _Any_data local_188;
  undefined1 local_178 [16];
  undefined1 local_168 [24];
  cmExecutionStatus *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  ActionMap *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Any_data local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined1 local_108 [16];
  pointer local_f8;
  anon_class_40_5_733c87e0 local_e8;
  cmExecutionStatus *local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  undefined1 local_a0 [72];
  undefined1 local_58;
  anon_class_32_4_cfdc72da local_50;
  
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = (pointer)0x0;
  local_e8.rawArg = &local_300;
  local_300 = 0;
  local_e8.expArg = &local_350;
  local_350 = 0;
  local_e8.expArgs =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_2f8;
  local_e8.args = args;
  local_e8.status = status;
  local_50.args = args;
  local_50.rawArg = local_e8.rawArg;
  local_50.status = status;
  local_50.expArgs =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)local_2f8;
  do {
    pcVar1 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(args->
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
               -0x5555555555555555) <= local_300) {
      local_2b8._0_8_ = &local_2a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b8,"called with incorrect number of arguments","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      cmSystemTools::s_FatalErrorOccurred = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._0_8_ != &local_2a8) goto LAB_001ae703;
      goto LAB_001ae713;
    }
    local_2b8 = (undefined1  [16])0x0;
    local_2a8._M_allocated_capacity = 0;
    pcVar23 = pcVar1 + local_300;
    local_300 = local_300 + 1;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<cmListFileArgument_const&>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)local_2b8,pcVar23);
    cmMakefile::ExpandArguments
              (status->Makefile,
               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_2b8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2f8);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_2b8);
    uVar24 = (long)(local_2f8._8_8_ - local_2f8._0_8_) >> 5;
  } while (uVar24 <= local_350);
  if (((pointer)(local_2f8._0_8_ + local_350 * 0x20))->_M_string_length == 0x17) {
    pcVar2 = (((pointer)(local_2f8._0_8_ + local_350 * 0x20))->_M_dataplus)._M_p;
    auVar29[0] = -(pcVar2[7] == 'E');
    auVar29[1] = -(pcVar2[8] == 'N');
    auVar29[2] = -(pcVar2[9] == 'D');
    auVar29[3] = -(pcVar2[10] == 'E');
    auVar29[4] = -(pcVar2[0xb] == 'N');
    auVar29[5] = -(pcVar2[0xc] == 'C');
    auVar29[6] = -(pcVar2[0xd] == 'Y');
    auVar29[7] = -(pcVar2[0xe] == '_');
    auVar29[8] = -(pcVar2[0xf] == 'P');
    auVar29[9] = -(pcVar2[0x10] == 'R');
    auVar29[10] = -(pcVar2[0x11] == 'O');
    auVar29[0xb] = -(pcVar2[0x12] == 'V');
    auVar29[0xc] = -(pcVar2[0x13] == 'I');
    auVar29[0xd] = -(pcVar2[0x14] == 'D');
    auVar29[0xe] = -(pcVar2[0x15] == 'E');
    auVar29[0xf] = -(pcVar2[0x16] == 'R');
    auVar28[0] = -(*pcVar2 == 'S');
    auVar28[1] = -(pcVar2[1] == 'E');
    auVar28[2] = -(pcVar2[2] == 'T');
    auVar28[3] = -(pcVar2[3] == '_');
    auVar28[4] = -(pcVar2[4] == 'D');
    auVar28[5] = -(pcVar2[5] == 'E');
    auVar28[6] = -(pcVar2[6] == 'P');
    auVar28[7] = -(pcVar2[7] == 'E');
    auVar28[8] = -(pcVar2[8] == 'N');
    auVar28[9] = -(pcVar2[9] == 'D');
    auVar28[10] = -(pcVar2[10] == 'E');
    auVar28[0xb] = -(pcVar2[0xb] == 'N');
    auVar28[0xc] = -(pcVar2[0xc] == 'C');
    auVar28[0xd] = -(pcVar2[0xd] == 'Y');
    auVar28[0xe] = -(pcVar2[0xe] == '_');
    auVar28[0xf] = -(pcVar2[0xf] == 'P');
    auVar28 = auVar28 & auVar29;
    if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar28[0xf] >> 7) << 0xf) != 0xffff) {
      local_188._M_pod_data[8] = 0;
      goto LAB_001ae744;
    }
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    vector<__gnu_cxx::__normal_iterator<cmListFileArgument_const*,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>,void>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)local_2b8,
               (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
               _M_impl.super__Vector_impl_data._M_start + local_300,
               (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
               _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)local_1c8);
    cmMakefile::ExpandArguments
              (status->Makefile,
               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_2b8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2f8);
    local_300 = ((long)(args->
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_2b8);
    this_00 = cmMakefile::GetState(status->Makefile);
    if (this_00->ProcessingTopLevelIncludes == false) {
      local_1c8._0_8_ = 0xf8;
      local_2b8._0_8_ = &local_2a8;
      __dest = (void *)std::__cxx11::string::_M_create((ulong *)local_2b8,(ulong)local_1c8);
      local_2b8._0_8_ = __dest;
      uVar26 = local_1c8._0_8_;
      local_2a8._M_allocated_capacity = local_1c8._0_8_;
      memcpy(__dest,
             "Dependency providers can only be set as part of the first call to project(). More specifically, cmake_language(SET_DEPENDENCY_PROVIDER) can only be called while the first project() command processes files listed in CMAKE_PROJECT_TOP_LEVEL_INCLUDES."
             ,0xf8);
      local_2b8._8_8_ = uVar26;
      *(undefined1 *)((long)__dest + uVar26) = 0;
      std::__cxx11::string::_M_assign((string *)&status->Error);
      cmSystemTools::s_FatalErrorOccurred = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._0_8_ != &local_2a8) {
LAB_001ae703:
        cmSystemTools::s_FatalErrorOccurred = true;
        operator_delete((void *)local_2b8._0_8_,local_2a8._M_allocated_capacity + 1);
      }
LAB_001ae713:
      bVar15 = false;
      goto LAB_001b0059;
    }
    local_168._0_16_ = (undefined1  [16])0x0;
    local_178 = (undefined1  [16])0x0;
    local_188 = (_Any_data)0x0;
    _local_198 = (undefined1  [16])0x0;
    _Stack_1b0._8_8_ = 0;
    pcStack_1a0 = (char *)0x0;
    _local_1b8 = (undefined1  [16])0x0;
    local_1c8._0_8_ = 0;
    local_1c8._8_8_ = (char *)0x0;
    _local_348 = (_Any_data)0x0;
    local_338._8_8_ =
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
         ::_M_invoke;
    local_338._0_8_ =
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
         ::_M_manager;
    name._M_str = "SET_DEPENDENCY_PROVIDER";
    name._M_len = 0x17;
    ArgumentParser::Base::Bind((Base *)local_1c8,name,(KeywordAction *)local_348);
    if ((_Manager_type)local_338._0_8_ != (_Manager_type)0x0) {
      (*(code *)local_338._0_8_)(local_348,local_348,3);
    }
    _local_348 = (_Any_data)ZEXT816(0x20);
    local_338._8_8_ =
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
         ::_M_invoke;
    local_338._0_8_ =
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
         ::_M_manager;
    name_00._M_str = "SUPPORTED_METHODS";
    name_00._M_len = 0x11;
    ArgumentParser::Base::Bind((Base *)local_1c8,name_00,(KeywordAction *)local_348);
    if ((_Manager_type)local_338._0_8_ != (_Manager_type)0x0) {
      (*(code *)local_338._0_8_)(local_348,local_348,3);
    }
    ArgumentParser::ActionMap::ActionMap((ActionMap *)local_2b8,(ActionMap *)local_1c8);
    std::
    vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
               *)(local_178 + 8));
    if ((_Manager_type)local_188._8_8_ != (_Manager_type)0x0) {
      (*(code *)local_188._8_8_)(auStack_190,auStack_190,3);
    }
    if ((_Manager_type)pcStack_1a0 != (_Manager_type)0x0) {
      (*(code *)pcStack_1a0)(&_Stack_1b0,&_Stack_1b0,3);
    }
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               *)local_1c8);
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_340 = (undefined1  [8])0x0;
    local_348 = (undefined1  [8])local_338;
    local_338._0_8_ = local_338._0_8_ & 0xffffffffffffff00;
    local_328 = (undefined1  [16])0x0;
    local_318 = (pointer)0x0;
    local_1c8._8_8_ = 0;
    local_1c8._0_8_ = (ActionMap *)local_2b8;
    _Stack_1b0._M_unused._M_object = (KeywordAction *)local_348;
    local_1b8 = (undefined1 *)&local_b8;
    _Stack_1b0._8_8_ = 0;
    pcStack_1a0 = (char *)0x0;
    _local_198 = (undefined1  [16])0x0;
    local_188 = (_Any_data)0x0;
    local_178 = (undefined1  [16])0x0;
    auVar7[0xf] = 0;
    auVar7._0_15_ = local_168._1_15_;
    local_168._0_16_ = auVar7 << 8;
    ArgumentParser::Instance::
    Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((Instance *)local_1c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2f8,0);
    if ((_Manager_type)local_178._0_8_ != (_Manager_type)0x0) {
      (*(code *)local_178._0_8_)(&local_188,&local_188,__destroy_functor);
    }
    if (local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      local_1c8._0_8_ = 0x2c;
      local_2d8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_2d8,(ulong)local_1c8);
      local_2d8.field_2._M_allocated_capacity = local_1c8._0_8_;
      builtin_strncpy(local_2d8._M_dataplus._M_p,"__FETCHCONTENT_MAKEAVAILABLE_SERIAL_PROVIDER",0x2c
                     );
      local_2d8._M_string_length = local_1c8._0_8_;
      local_2d8._M_dataplus._M_p[local_1c8._0_8_] = '\0';
      if (auStack_340 == (undefined1  [8])0x0) {
        if (local_328._0_8_ == local_328._8_8_) {
          if ((this_00->DependencyProvider).super__Optional_base<cmDependencyProvider,_false,_false>
              ._M_payload.super__Optional_payload<cmDependencyProvider,_true,_false,_false>.
              super__Optional_payload_base<cmDependencyProvider>._M_engaged == true) {
            std::_Optional_payload_base<cmDependencyProvider>::_M_destroy
                      ((_Optional_payload_base<cmDependencyProvider> *)&this_00->DependencyProvider)
            ;
          }
          bVar15 = true;
          cmState::SetGlobalProperty(this_00,&local_2d8,"");
        }
        else {
          local_1c8._0_8_ = &local_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,
                     "Must specify a non-empty command name when provider methods are given","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          cmSystemTools::s_FatalErrorOccurred = true;
          if ((undefined1 **)local_1c8._0_8_ != &local_1b8) {
            operator_delete((void *)local_1c8._0_8_,(ulong)((long)local_1b8 + 1));
          }
          bVar15 = false;
        }
      }
      else {
        cmState::GetCommand((Command *)&local_128,this_00,(string *)local_348);
        if ((code *)local_118._M_allocated_capacity == (code *)0x0) {
          local_1c8._8_8_ = "Command \"";
          local_1c8._0_8_ = 9;
          _Stack_1b0._M_unused._0_8_ = (undefined8)local_348;
          local_1b8 = (undefined1 *)auStack_340;
          pcStack_1a0 = "\" is not a defined command";
          _Stack_1b0._8_8_ = 0x1a;
          views_01._M_len = 3;
          views_01._M_array = (iterator)local_1c8;
          cmCatViews_abi_cxx11_((string *)local_208,views_01);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          cmSystemTools::s_FatalErrorOccurred = true;
          ppVar25 = (pointer)local_1f8._0_8_;
          _Var27._M_p = (pointer)local_208._0_8_;
          if ((ActionMap *)local_208._0_8_ != (ActionMap *)(local_208 + 0x10)) {
LAB_001afb55:
            cmSystemTools::s_FatalErrorOccurred = true;
            operator_delete(_Var27._M_p,(ulong)((long)&(ppVar25->first)._M_len + 1));
          }
LAB_001afb5d:
          bVar15 = false;
        }
        else {
          uVar26 = local_328._8_8_;
          if (local_328._0_8_ == local_328._8_8_) {
            local_1c8._0_8_ = &local_1b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,"Must specify at least one provider method","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            cmSystemTools::s_FatalErrorOccurred = true;
            if ((undefined1 **)local_1c8._0_8_ != &local_1b8) {
              ppVar25 = (pointer)local_1b8;
              _Var27._M_p = (pointer)local_1c8._0_8_;
              goto LAB_001afb55;
            }
            goto LAB_001afb5d;
          }
          local_1e8.
          super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1e8.
          super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1e8.
          super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (Method *)0x0;
          bVar15 = false;
          pbVar20 = (pointer)local_328._0_8_;
          do {
            iVar16 = std::__cxx11::string::compare((char *)pbVar20);
            if (iVar16 == 0) {
              auVar8._12_4_ = 0;
              auVar8._0_12_ = local_1c8._4_12_;
              local_1c8 = auVar8 << 0x20;
              if (local_1e8.
                  super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_1e8.
                  super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                ::_M_realloc_insert<cmDependencyProvider::Method>
                          (&local_1e8,
                           (iterator)
                           local_1e8.
                           super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(Method *)local_1c8);
              }
              else {
                *local_1e8.
                 super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                 ._M_impl.super__Vector_impl_data._M_finish = FindPackage;
                local_1e8.
                super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_1e8.
                     super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            else {
              iVar16 = std::__cxx11::string::compare((char *)pbVar20);
              if (iVar16 != 0) {
                local_1c8._8_8_ = "Unknown dependency provider method \"";
                local_1c8._0_8_ = 0x24;
                _Stack_1b0._M_unused._M_object = (pbVar20->_M_dataplus)._M_p;
                local_1b8 = (undefined1 *)pbVar20->_M_string_length;
                pcStack_1a0 = "\"";
                _Stack_1b0._8_8_ = 1;
                views_02._M_len = 3;
                views_02._M_array = (iterator)local_1c8;
                cmCatViews_abi_cxx11_((string *)local_208,views_02);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                cmSystemTools::s_FatalErrorOccurred = true;
                if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
                  operator_delete((void *)local_208._0_8_,(ulong)(local_1f8._0_8_ + 1));
                }
                bVar15 = false;
                goto LAB_001afd19;
              }
              local_1c8._0_4_ = 1;
              if (local_1e8.
                  super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_1e8.
                  super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                ::_M_realloc_insert<cmDependencyProvider::Method>
                          (&local_1e8,
                           (iterator)
                           local_1e8.
                           super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                           ._M_impl.super__Vector_impl_data._M_finish,(Method *)local_1c8);
              }
              else {
                *local_1e8.
                 super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                 ._M_impl.super__Vector_impl_data._M_finish = FetchContentMakeAvailableSerial;
                local_1e8.
                super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_1e8.
                     super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              bVar15 = true;
            }
            pbVar20 = pbVar20 + 1;
          } while (pbVar20 != (pointer)uVar26);
          local_148 = &local_138;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_348,(long)auStack_340 + (long)local_348);
          std::vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>::
          vector((vector<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                  *)local_108,&local_1e8);
          local_240.Command._M_dataplus._M_p = (pointer)&local_240.Command.field_2;
          if (local_148 == &local_138) {
            local_240.Command.field_2._8_8_ = local_138._8_8_;
          }
          else {
            local_240.Command._M_dataplus._M_p = (pointer)local_148;
          }
          local_240.Command._M_string_length = (size_type)local_140;
          local_140 = (ActionMap *)0x0;
          local_138._M_local_buf[0] = '\0';
          local_240.Methods.
          super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_108._0_8_;
          local_240.Methods.
          super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_108._8_8_;
          local_240.Methods.
          super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_f8;
          local_108 = (undefined1  [16])0x0;
          local_f8 = (pointer)0x0;
          local_148 = &local_138;
          std::optional<cmDependencyProvider>::operator=(&this_00->DependencyProvider,&local_240);
          cmDependencyProvider::~cmDependencyProvider(&local_240);
          if ((pointer)local_108._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_108._0_8_,(long)local_f8 - local_108._0_8_);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,
                            CONCAT71(local_138._M_allocated_capacity._1_7_,local_138._M_local_buf[0]
                                    ) + 1);
          }
          if (bVar15) {
            value = local_348;
          }
          else {
            value = (undefined1  [8])0x6e77f9;
          }
          bVar15 = true;
          cmState::SetGlobalProperty(this_00,&local_2d8,(char *)value);
LAB_001afd19:
          if (local_1e8.
              super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1e8.
                            super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1e8.
                                  super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1e8.
                                  super__Vector_base<cmDependencyProvider::Method,_std::allocator<cmDependencyProvider::Method>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if ((code *)local_118._M_allocated_capacity != (code *)0x0) {
          (*(code *)local_118._M_allocated_capacity)(&local_128,&local_128,3);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,
                        (ulong)(local_2d8.field_2._M_allocated_capacity + 1));
      }
    }
    else {
      local_1c8._8_8_ = "Unrecognized keyword: \"";
      local_1c8._0_8_ = 0x17;
      _Stack_1b0._M_unused._M_object =
           ((local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_1b8 = (undefined1 *)
                  (local_b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
      pcStack_1a0 = "\"";
      _Stack_1b0._8_8_ = 1;
      views._M_len = 3;
      views._M_array = (iterator)local_1c8;
      cmCatViews_abi_cxx11_(&local_2d8,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      cmSystemTools::s_FatalErrorOccurred = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,
                        (ulong)(local_2d8.field_2._M_allocated_capacity + 1));
      }
      bVar15 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_328);
    if (local_348 != (undefined1  [8])local_338) {
      operator_delete((void *)local_348,(ulong)(local_338._0_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    std::
    vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
               *)(local_270 + 0x10));
    if ((pointer)local_270._0_8_ != (pointer)0x0) {
      (*(code *)local_270._0_8_)(local_288._M_local_buf + 8,local_288._M_local_buf + 8,3);
    }
    if ((_Manager_type)local_298._8_8_ != (_Manager_type)0x0) {
      (*(code *)local_298._8_8_)(local_2a8._M_local_buf + 8,local_2a8._M_local_buf + 8,3);
    }
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               *)local_2b8);
    goto LAB_001b0059;
  }
  local_188._M_pod_data[8] = 0;
  if ((((pointer)(local_2f8._0_8_ + local_350 * 0x20))->_M_string_length == 5) &&
     (piVar3 = (int *)(((pointer)(local_2f8._0_8_ + local_350 * 0x20))->_M_dataplus)._M_p,
     (char)piVar3[1] == 'R' && *piVar3 == 0x45464544)) {
    local_350 = local_350 + 1;
    if (uVar24 <= local_350) {
      do {
        pcVar1 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(args->
                           super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                   -0x5555555555555555) <= local_300) {
          local_2b8._0_8_ = &local_2a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b8,"DEFER requires at least one argument","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_001af707;
        }
        local_2b8 = (undefined1  [16])0x0;
        local_2a8._M_allocated_capacity = 0;
        pcVar23 = pcVar1 + local_300;
        local_300 = local_300 + 1;
        std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
        emplace_back<cmListFileArgument_const&>
                  ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)local_2b8,
                   pcVar23);
        cmMakefile::ExpandArguments
                  (status->Makefile,
                   (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_2b8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2f8);
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                  ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_2b8);
      } while ((ulong)((long)(local_2f8._8_8_ - local_2f8._0_8_) >> 5) <= local_350);
    }
    local_2b8._8_8_ = 0;
    local_2b8._0_8_ = &local_2a8;
    local_2a8._M_allocated_capacity = local_2a8._M_allocated_capacity & 0xffffffffffffff00;
    local_298._M_allocated_capacity = (size_type)&local_288;
    local_298._8_8_ = (_Manager_type)0x0;
    local_288._M_local_buf[0] = '\0';
    local_278 = (cmMakefile *)0x0;
    pbVar20 = (pointer)local_2f8._0_8_;
    pbVar22 = (pointer)local_2f8._8_8_;
LAB_001aee3d:
    if (local_350 < (ulong)((long)pbVar22 - (long)pbVar20 >> 5)) {
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pbVar20[local_350]._M_dataplus._M_p;
      pAVar5 = (ActionMap *)pbVar20[local_350]._M_string_length;
      switch(pAVar5) {
      case (ActionMap *)0x2:
        if (*(short *)paVar4 == 0x4449) {
          local_350 = local_350 + 1;
          if ((pointer)local_2b8._8_8_ == (pointer)0x0) {
            while ((ulong)((long)pbVar22 - (long)pbVar20 >> 5) <= local_350) {
              pcVar1 = (args->
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if ((ulong)(((long)(args->
                                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                         -0x5555555555555555) <= local_300) {
                local_348 = (undefined1  [8])local_338;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_348,"DEFER ID missing value","");
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_001aff85;
              }
              _local_348 = (_Any_data)0x0;
              local_338._0_8_ = (ActionMap *)0x0;
              pcVar23 = pcVar1 + local_300;
              local_300 = local_300 + 1;
              std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
              emplace_back<cmListFileArgument_const&>
                        ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)local_348,
                         pcVar23);
              cmMakefile::ExpandArguments
                        (status->Makefile,
                         (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                         local_348,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f8);
              std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                        ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                         local_348);
              pbVar20 = (pointer)local_2f8._0_8_;
              pbVar22 = (pointer)local_2f8._8_8_;
            }
            local_350 = local_350 + 1;
            std::__cxx11::string::_M_assign((string *)local_2b8);
            if ((pointer)local_2b8._8_8_ == (pointer)0x0) {
              local_348 = (undefined1  [8])local_338;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_348,"DEFER ID may not be empty","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
            }
            else {
              if (0x19 < (byte)(*(char *)local_2b8._0_8_ + 0xbfU)) goto LAB_001aeeb1;
              local_348 = (undefined1  [8])local_338;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_348,"DEFER ID may not start in A-Z.","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
            }
          }
          else {
            local_348 = (undefined1  [8])local_338;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_348,"DEFER given multiple ID arguments","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
          }
          goto LAB_001aff85;
        }
        break;
      case (ActionMap *)0x4:
        if (*(int *)paVar4 == 0x4c4c4143) goto LAB_001aff1e;
        break;
      case (ActionMap *)0x6:
        if ((short)*(int *)(paVar4->_M_local_buf + 4) == 0x5241 && *(int *)paVar4 == 0x565f4449) {
          local_350 = local_350 + 1;
          if ((_Manager_type)local_298._8_8_ == (_Manager_type)0x0) {
            while ((ulong)((long)pbVar22 - (long)pbVar20 >> 5) <= local_350) {
              pcVar1 = (args->
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if ((ulong)(((long)(args->
                                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                         -0x5555555555555555) <= local_300) {
                local_348 = (undefined1  [8])local_338;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_348,"DEFER ID_VAR missing variable name","");
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_001aff85;
              }
              _local_348 = (_Any_data)0x0;
              local_338._0_8_ = (ActionMap *)0x0;
              pcVar23 = pcVar1 + local_300;
              local_300 = local_300 + 1;
              std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
              emplace_back<cmListFileArgument_const&>
                        ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)local_348,
                         pcVar23);
              cmMakefile::ExpandArguments
                        (status->Makefile,
                         (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                         local_348,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f8);
              std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                        ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                         local_348);
              pbVar20 = (pointer)local_2f8._0_8_;
              pbVar22 = (pointer)local_2f8._8_8_;
            }
            local_350 = local_350 + 1;
            std::__cxx11::string::_M_assign((string *)local_298._M_local_buf);
            if ((_Manager_type)local_298._8_8_ != (_Manager_type)0x0) goto LAB_001aeeb1;
            local_348 = (undefined1  [8])local_338;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_348,"DEFER ID_VAR may not be empty","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
          }
          else {
            local_348 = (undefined1  [8])local_338;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_348,"DEFER given multiple ID_VAR arguments","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
          }
          goto LAB_001aff85;
        }
        break;
      case (ActionMap *)0x8:
        if (paVar4->_M_allocated_capacity != 0x4c4c41435f544547) break;
        goto LAB_001afe58;
      case (ActionMap *)0x9:
        if ((char)*(ulong *)(paVar4->_M_local_buf + 8) != 'Y' ||
            paVar4->_M_allocated_capacity != 0x524f544345524944) break;
        local_350 = local_350 + 1;
        if ((cmMakefile *)local_278 == (cmMakefile *)0x0) {
          if ((ulong)((long)pbVar22 - (long)pbVar20 >> 5) <= local_350) {
            do {
              pcVar1 = (args->
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if ((ulong)(((long)(args->
                                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
                         -0x5555555555555555) <= local_300) {
                local_348 = (undefined1  [8])local_338;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_348,"DEFER DIRECTORY missing value","");
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_001aff85;
              }
              _local_348 = (_Any_data)0x0;
              local_338._0_8_ = (ActionMap *)0x0;
              pcVar23 = pcVar1 + local_300;
              local_300 = local_300 + 1;
              std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
              emplace_back<cmListFileArgument_const&>
                        ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)local_348,
                         pcVar23);
              cmMakefile::ExpandArguments
                        (status->Makefile,
                         (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                         local_348,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2f8);
              std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                        ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                         local_348);
              pbVar20 = (pointer)local_2f8._0_8_;
            } while ((ulong)((long)(local_2f8._8_8_ - local_2f8._0_8_) >> 5) <= local_350);
          }
          local_240.Command._M_dataplus._M_p = (pointer)&local_240.Command.field_2;
          pcVar6 = pbVar20[local_350]._M_dataplus._M_p;
          pbVar20 = pbVar20 + local_350;
          local_350 = local_350 + 1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,pcVar6,pcVar6 + pbVar20->_M_string_length);
          if ((ActionMap *)local_240.Command._M_string_length == (ActionMap *)0x0) {
            local_348 = (undefined1  [8])local_338;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_348,"DEFER DIRECTORY may not be empty","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
            cmSystemTools::s_FatalErrorOccurred = true;
            uVar26 = local_338._0_8_;
            _Var27._M_p = (pointer)local_348;
            if (local_348 != (undefined1  [8])local_338) {
LAB_001b0282:
              cmSystemTools::s_FatalErrorOccurred = true;
              operator_delete(_Var27._M_p,
                              (ulong)((long)&(((ActionMap *)uVar26)->Keywords).
                                             super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                             .
                                             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 1));
            }
          }
          else {
            psVar18 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
            cmsys::SystemTools::CollapseFullPath((string *)local_348,&local_240.Command,psVar18);
            std::__cxx11::string::operator=((string *)&local_240,(string *)local_348);
            if (local_348 != (undefined1  [8])local_338) {
              operator_delete((void *)local_348,(ulong)(local_338._0_8_ + 1));
            }
            this_01 = cmMakefile::GetGlobalGenerator(status->Makefile);
            local_278 = cmGlobalGenerator::FindMakefile(this_01,&local_240.Command);
            if ((cmMakefile *)local_278 != (cmMakefile *)0x0) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240.Command._M_dataplus._M_p != &local_240.Command.field_2) {
                operator_delete(local_240.Command._M_dataplus._M_p,
                                (ulong)(local_240.Command.field_2._M_allocated_capacity + 1));
              }
              goto LAB_001aeeb1;
            }
            auStack_340 = (undefined1  [8])"DEFER DIRECTORY:\n  ";
            local_348 = (undefined1  [8])0x13;
            local_338._0_8_ = local_240.Command._M_string_length;
            local_338._8_8_ = local_240.Command._M_dataplus._M_p;
            local_328._8_8_ = "\nis not known.  ";
            local_328._0_8_ = 0x10;
            local_318 = (pointer)0x23;
            local_310 = "It may not have been processed yet.";
            views_04._M_len = 4;
            views_04._M_array = (iterator)local_348;
            cmCatViews_abi_cxx11_(&local_2d8,views_04);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            cmSystemTools::s_FatalErrorOccurred = true;
            uVar26 = local_2d8.field_2._M_allocated_capacity;
            _Var27._M_p = local_2d8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) goto LAB_001b0282;
          }
          goto LAB_001afef8;
        }
        local_348 = (undefined1  [8])local_338;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_348,"DEFER given multiple DIRECTORY arguments","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_001aff85;
      case (ActionMap *)0xb:
        uVar24 = paVar4->_M_allocated_capacity ^ 0x435f4c45434e4143;
        uVar21 = *(ulong *)(paVar4->_M_local_buf + 3) ^ 0x4c4c41435f4c4543;
        goto LAB_001afe53;
      case (ActionMap *)0xc:
        uVar24 = paVar4->_M_allocated_capacity ^ 0x4c4c41435f544547;
        uVar21 = (ulong)(uint)*(ulong *)(paVar4->_M_local_buf + 8) ^ 0x5344495f;
LAB_001afe53:
        if (uVar21 != 0 || uVar24 != 0) break;
LAB_001afe58:
        if ((_Manager_type)local_298._8_8_ != (_Manager_type)0x0 ||
            (pointer)local_2b8._8_8_ != (pointer)0x0) {
          auStack_340 = (undefined1  [8])"DEFER ";
          local_348 = (undefined1  [8])0x6;
          local_328._8_8_ = " does not accept ID or ID_VAR.";
          local_328._0_8_ = 0x1e;
          views_05._M_len = 3;
          views_05._M_array = (iterator)local_348;
          local_338._0_8_ = pAVar5;
          local_338._8_8_ = paVar4;
          cmCatViews_abi_cxx11_(&local_240.Command,views_05);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_001afeee;
        }
        cmCMakeLanguageCommand::anon_class_32_4_cfdc72da::operator()(&local_50);
        bVar15 = anon_unknown.dwarf_319c87::cmCMakeLanguageCommandDEFER
                           ((anon_unknown_dwarf_319c87 *)local_278,(Defer *)local_2f8._0_8_,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2f8._8_8_,local_350,status);
        bVar11 = false;
        goto LAB_001affab;
      }
      auStack_340 = (undefined1  [8])"DEFER unknown option:\n  ";
      local_348 = (undefined1  [8])0x18;
      views_03._M_len = 2;
      views_03._M_array = (iterator)local_348;
      local_338._0_8_ = pAVar5;
      local_338._8_8_ = paVar4;
      cmCatViews_abi_cxx11_(&local_240.Command,views_03);
      std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001afeee:
      cmSystemTools::s_FatalErrorOccurred = true;
LAB_001afef8:
      _Var27._M_p = local_240.Command._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.Command._M_dataplus._M_p == &local_240.Command.field_2) goto LAB_001affa6;
      goto LAB_001aff9e;
    }
    pcVar1 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (local_300 <
        (ulong)(((long)(args->
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) *
               -0x5555555555555555)) {
      _local_348 = (_Any_data)0x0;
      local_338._0_8_ = (ActionMap *)0x0;
      pcVar23 = pcVar1 + local_300;
      local_300 = local_300 + 1;
      std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
      emplace_back<cmListFileArgument_const&>
                ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)local_348,pcVar23)
      ;
      cmMakefile::ExpandArguments
                (status->Makefile,
                 (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_348,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2f8);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_348);
LAB_001aeeb1:
      pbVar20 = (pointer)local_2f8._0_8_;
      pbVar22 = (pointer)local_2f8._8_8_;
      goto LAB_001aee3d;
    }
LAB_001aff1e:
    bVar15 = cmCMakeLanguageCommand::anon_class_40_5_733c87e0::operator()(&local_e8);
    if (((bVar15) && (((pointer)(local_2f8._0_8_ + local_350 * 0x20))->_M_string_length == 4)) &&
       (*(int *)(((pointer)(local_2f8._0_8_ + local_350 * 0x20))->_M_dataplus)._M_p == 0x4c4c4143))
    {
      std::optional<(anonymous_namespace)::Defer>::operator=
                ((optional<(anonymous_namespace)::Defer> *)local_1c8,(Defer *)local_2b8);
      bVar11 = true;
      goto LAB_001affa9;
    }
    local_348 = (undefined1  [8])local_338;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_348,"DEFER must be followed by a CALL argument","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001aff85:
    cmSystemTools::s_FatalErrorOccurred = true;
    local_240.Command.field_2._M_allocated_capacity = local_338._0_8_;
    _Var27._M_p = (pointer)local_348;
    if (local_348 != (undefined1  [8])local_338) {
LAB_001aff9e:
      operator_delete(_Var27._M_p,
                      (ulong)((long)&(((ActionMap *)local_240.Command.field_2._M_allocated_capacity)
                                     ->Keywords).
                                     super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                     .
                                     super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
LAB_001affa6:
    bVar11 = false;
LAB_001affa9:
    bVar15 = false;
LAB_001affab:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != &local_288) {
      operator_delete((void *)local_298._M_allocated_capacity,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._0_8_ != &local_2a8) {
      operator_delete((void *)local_2b8._0_8_,local_2a8._M_allocated_capacity + 1);
    }
    if (bVar11) {
      goto LAB_001ae744;
    }
  }
  else {
LAB_001ae744:
    iVar16 = std::__cxx11::string::compare((char *)(local_2f8._0_8_ + local_350 * 0x20));
    pvVar14 = local_e8.args;
    psVar13 = local_e8.rawArg;
    outArgs = local_e8.expArgs;
    psVar12 = local_e8.expArg;
    if (iVar16 == 0) {
      local_350 = local_350 + 1;
      if ((ulong)((long)((local_e8.expArgs)->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)((local_e8.expArgs)->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= *local_e8.expArg) {
        local_c0 = local_e8.status;
        local_150 = status;
        do {
          if ((ulong)(((long)(pvVar14->
                             super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar14->
                             super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)
              <= *psVar13) {
            local_2b8._0_8_ = &local_2a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2b8,"CALL missing command name","");
            std::__cxx11::string::_M_assign((string *)&local_150->Error);
            goto LAB_001af707;
          }
          local_2b8 = (undefined1  [16])0x0;
          local_2a8._M_allocated_capacity = 0;
          uVar24 = *psVar13;
          *psVar13 = uVar24 + 1;
          std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
          emplace_back<cmListFileArgument_const&>
                    ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)local_2b8,
                     (pvVar14->
                     super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
                     _M_impl.super__Vector_impl_data._M_start + uVar24);
          cmMakefile::ExpandArguments
                    (local_c0->Makefile,
                     (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_2b8,
                     outArgs);
          std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                    ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_2b8);
          status = local_150;
        } while ((ulong)((long)(outArgs->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(outArgs->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 5) <= *psVar12);
      }
      uVar24 = local_350 + 1;
      if (uVar24 == (long)(local_2f8._8_8_ - local_2f8._0_8_) >> 5) {
        psVar18 = (string *)(local_2f8._0_8_ + local_350 * 0x20);
        local_58 = 0;
        if (local_188._M_pod_data[8] == '\x01') {
          local_a0._0_8_ = (long)local_a0 + 0x10;
          if ((undefined1 **)local_1c8._0_8_ == &local_1b8) {
            local_a0._24_8_ = _Stack_1b0._M_unused._M_object;
          }
          else {
            local_a0._0_8_ = local_1c8._0_8_;
          }
          local_a0._16_8_ = local_1b8;
          local_a0._32_8_ =
               &(((_Storage<(anonymous_namespace)::Defer,_false> *)local_a0)->_M_value).IdVar.
                field_2;
          local_a0._8_8_ = local_1c8._8_8_;
          local_1c8._8_8_ = 0;
          local_1c8._0_8_ = &local_1b8;
          auVar9[0xf] = 0;
          auVar9._0_15_ = stack0xfffffffffffffe49;
          _local_1b8 = auVar9 << 8;
          if ((undefined8 *)_Stack_1b0._8_8_ == &local_198) {
            local_a0._56_8_ = auStack_190;
          }
          else {
            local_a0._32_8_ = _Stack_1b0._8_8_;
          }
          local_a0._48_8_ = local_198;
          local_a0._40_8_ = pcStack_1a0;
          pcStack_1a0 = (char *)0x0;
          _Stack_1b0._8_8_ = &local_198;
          auVar10[0xf] = 0;
          auVar10._0_15_ = stack0xfffffffffffffe69;
          _local_198 = auVar10 << 8;
          local_a0._64_8_ = local_188._0_8_;
          local_58 = 1;
        }
        local_350 = uVar24;
        bVar15 = anon_unknown.dwarf_319c87::cmCMakeLanguageCommandCALL
                           (args,psVar18,local_300,
                            (optional<(anonymous_namespace)::Defer> *)
                            &((_Storage<(anonymous_namespace)::Defer,_false> *)local_a0)->_M_value,
                            status);
        std::_Optional_base<(anonymous_namespace)::Defer,_false,_false>::~_Optional_base
                  ((_Optional_base<(anonymous_namespace)::Defer,_false,_false> *)
                   &((_Storage<(anonymous_namespace)::Defer,_false> *)local_a0)->_M_value);
      }
      else {
        local_2b8._0_8_ = &local_2a8;
        local_350 = uVar24;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b8,"CALL command\'s arguments must be literal","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001af707:
        cmSystemTools::s_FatalErrorOccurred = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._0_8_ != &local_2a8) {
          operator_delete((void *)local_2b8._0_8_,local_2a8._M_allocated_capacity + 1);
        }
        bVar15 = false;
      }
    }
    else {
      iVar16 = std::__cxx11::string::compare((char *)(local_2f8._0_8_ + local_350 * 0x20));
      if (iVar16 == 0) {
        this = status->Makefile;
        cmMakefile::GetBacktrace(this);
        pcVar17 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_348);
        cmListFileContext::cmListFileContext((cmListFileContext *)local_2b8,pcVar17);
        if (auStack_340 != (undefined1  [8])0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_340);
        }
        local_208 = (undefined1  [16])0x0;
        local_1f8._0_8_ = (pointer)0x0;
        cmMakefile::ExpandArguments
                  (this,args,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_208);
        if ((ulong)(local_208._8_8_ - local_208._0_8_) < 0x21) {
          local_348 = (undefined1  [8])local_338;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_348,"called with incorrect number of arguments","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001af767:
          cmSystemTools::s_FatalErrorOccurred = true;
          if (local_348 != (undefined1  [8])local_338) {
            operator_delete((void *)local_348,(ulong)(local_338._0_8_ + 1));
          }
          bVar15 = false;
        }
        else {
          iVar16 = std::__cxx11::string::compare((char *)(local_208._0_8_ + 0x20));
          if (iVar16 != 0) {
            _Var19 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[5]>>
                               ((pointer)(local_208._0_8_ + 0x40),local_208._8_8_,"CODE");
            if (_Var19._M_current ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208._8_8_
               ) {
              local_348 = (undefined1  [8])local_338;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_348,"called without CODE argument","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
            }
            else {
              local_348 = (undefined1  [8])local_338;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_348,
                         "called with unsupported arguments between EVAL and CODE arguments","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
            }
            goto LAB_001af767;
          }
          local_348 = (undefined1  [8])(local_208._0_8_ + 0x40);
          auStack_340 = (undefined1  [8])local_208._8_8_;
          separator._M_str = " ";
          separator._M_len = 1;
          cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    (&local_2d8,
                     (cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_348,separator);
          auStack_340 = (undefined1  [8])local_298._M_allocated_capacity;
          local_348 = (undefined1  [8])local_298._8_8_;
          local_338._0_8_ = (ActionMap *)0x1;
          local_338._8_8_ = (long)"    :" + 4;
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&local_240,local_278);
          local_328._8_8_ = local_240.Command._M_string_length;
          local_328._0_8_ = local_240.Command._M_dataplus._M_p;
          local_318 = (pointer)0x5;
          local_310 = ":EVAL";
          views_00._M_len = 4;
          views_00._M_array = (iterator)local_348;
          cmCatViews_abi_cxx11_((string *)&local_128,views_00);
          bVar15 = cmMakefile::ReadListFileAsString(this,&local_2d8,(string *)&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_unused._0_8_ != &local_118) {
            operator_delete(local_128._M_unused._M_object,
                            (ulong)(local_118._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,
                            (ulong)(local_2d8.field_2._M_allocated_capacity + 1));
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_208);
        if ((local_250 == true) &&
           (local_250 = false, (undefined1 *)local_270._0_8_ != local_270 + 0x10)) {
          operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_allocated_capacity != &local_288) {
          operator_delete((void *)local_298._M_allocated_capacity,
                          CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._0_8_ != &local_2a8) {
          operator_delete((void *)local_2b8._0_8_,local_2a8._M_allocated_capacity + 1);
        }
      }
      else {
        iVar16 = std::__cxx11::string::compare((char *)(local_2f8._0_8_ + local_350 * 0x20));
        if (iVar16 != 0) {
          local_2b8._0_8_ = &local_2a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b8,"called with unknown meta-operation","");
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_001af707;
        }
        bVar15 = anon_unknown.dwarf_319c87::cmCMakeLanguageCommandGET_MESSAGE_LOG_LEVEL(args,status)
        ;
      }
    }
  }
  if (local_188._M_pod_data[8] == '\x01') {
    local_188._M_pod_data[8] = 0;
    if ((undefined8 *)_Stack_1b0._8_8_ != &local_198) {
      operator_delete((void *)_Stack_1b0._8_8_,(ulong)(local_198 + 1));
    }
    if ((undefined1 **)local_1c8._0_8_ != &local_1b8) {
      operator_delete((void *)local_1c8._0_8_,(ulong)((long)local_1b8 + 1));
    }
  }
LAB_001b0059:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2f8);
  return bVar15;
}

Assistant:

bool cmCMakeLanguageCommand(std::vector<cmListFileArgument> const& args,
                            cmExecutionStatus& status)
{
  std::vector<std::string> expArgs;
  size_t rawArg = 0;
  size_t expArg = 0;

  // Helper to consume and expand one raw argument at a time.
  auto moreArgs = [&]() -> bool {
    while (expArg >= expArgs.size()) {
      if (rawArg >= args.size()) {
        return false;
      }
      std::vector<cmListFileArgument> tmpArg;
      tmpArg.emplace_back(args[rawArg++]);
      status.GetMakefile().ExpandArguments(tmpArg, expArgs);
    }
    return true;
  };
  auto finishArgs = [&]() {
    std::vector<cmListFileArgument> tmpArgs(args.begin() + rawArg, args.end());
    status.GetMakefile().ExpandArguments(tmpArgs, expArgs);
    rawArg = args.size();
  };

  if (!moreArgs()) {
    return FatalError(status, "called with incorrect number of arguments");
  }

  if (expArgs[expArg] == "SET_DEPENDENCY_PROVIDER"_s) {
    finishArgs();
    return cmCMakeLanguageCommandSET_DEPENDENCY_PROVIDER(expArgs, status);
  }

  cm::optional<Defer> maybeDefer;
  if (expArgs[expArg] == "DEFER"_s) {
    ++expArg; // Consume "DEFER".

    if (!moreArgs()) {
      return FatalError(status, "DEFER requires at least one argument");
    }

    Defer defer;

    // Process optional arguments.
    while (moreArgs()) {
      if (expArgs[expArg] == "CALL"_s) {
        break;
      }
      if (expArgs[expArg] == "CANCEL_CALL"_s ||
          expArgs[expArg] == "GET_CALL_IDS"_s ||
          expArgs[expArg] == "GET_CALL"_s) {
        if (!defer.Id.empty() || !defer.IdVar.empty()) {
          return FatalError(status,
                            cmStrCat("DEFER "_s, expArgs[expArg],
                                     " does not accept ID or ID_VAR."_s));
        }
        finishArgs();
        return cmCMakeLanguageCommandDEFER(defer, expArgs, expArg, status);
      }
      if (expArgs[expArg] == "DIRECTORY"_s) {
        ++expArg; // Consume "DIRECTORY".
        if (defer.Directory) {
          return FatalError(status,
                            "DEFER given multiple DIRECTORY arguments");
        }
        if (!moreArgs()) {
          return FatalError(status, "DEFER DIRECTORY missing value");
        }
        std::string dir = expArgs[expArg++];
        if (dir.empty()) {
          return FatalError(status, "DEFER DIRECTORY may not be empty");
        }
        dir = cmSystemTools::CollapseFullPath(
          dir, status.GetMakefile().GetCurrentSourceDirectory());
        defer.Directory =
          status.GetMakefile().GetGlobalGenerator()->FindMakefile(dir);
        if (!defer.Directory) {
          return FatalError(status,
                            cmStrCat("DEFER DIRECTORY:\n  "_s, dir,
                                     "\nis not known.  "_s,
                                     "It may not have been processed yet."_s));
        }
      } else if (expArgs[expArg] == "ID"_s) {
        ++expArg; // Consume "ID".
        if (!defer.Id.empty()) {
          return FatalError(status, "DEFER given multiple ID arguments");
        }
        if (!moreArgs()) {
          return FatalError(status, "DEFER ID missing value");
        }
        defer.Id = expArgs[expArg++];
        if (defer.Id.empty()) {
          return FatalError(status, "DEFER ID may not be empty");
        }
        if (defer.Id[0] >= 'A' && defer.Id[0] <= 'Z') {
          return FatalError(status, "DEFER ID may not start in A-Z.");
        }
      } else if (expArgs[expArg] == "ID_VAR"_s) {
        ++expArg; // Consume "ID_VAR".
        if (!defer.IdVar.empty()) {
          return FatalError(status, "DEFER given multiple ID_VAR arguments");
        }
        if (!moreArgs()) {
          return FatalError(status, "DEFER ID_VAR missing variable name");
        }
        defer.IdVar = expArgs[expArg++];
        if (defer.IdVar.empty()) {
          return FatalError(status, "DEFER ID_VAR may not be empty");
        }
      } else {
        return FatalError(
          status, cmStrCat("DEFER unknown option:\n  "_s, expArgs[expArg]));
      }
    }

    if (!(moreArgs() && expArgs[expArg] == "CALL"_s)) {
      return FatalError(status, "DEFER must be followed by a CALL argument");
    }

    maybeDefer = std::move(defer);
  }

  if (expArgs[expArg] == "CALL") {
    ++expArg; // Consume "CALL".

    // CALL requires a command name.
    if (!moreArgs()) {
      return FatalError(status, "CALL missing command name");
    }
    std::string const& callCommand = expArgs[expArg++];

    // CALL accepts no further expanded arguments.
    if (expArg != expArgs.size()) {
      return FatalError(status, "CALL command's arguments must be literal");
    }

    // Run the CALL.
    return cmCMakeLanguageCommandCALL(args, callCommand, rawArg,
                                      std::move(maybeDefer), status);
  }

  if (expArgs[expArg] == "EVAL") {
    return cmCMakeLanguageCommandEVAL(args, status);
  }

  if (expArgs[expArg] == "GET_MESSAGE_LOG_LEVEL") {
    return cmCMakeLanguageCommandGET_MESSAGE_LOG_LEVEL(args, status);
  }

  return FatalError(status, "called with unknown meta-operation");
}